

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void console_message_integer(char *mes,int num)

{
  fprintf(_stderr,mes,num);
  return;
}

Assistant:

void console_message_integer(const char *mes, int num)
{
#if defined(_WIN32)
	char *temp = u8tosjis(mes);
	if (temp == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return;
	}
	fprintf(stderr, temp, num);
	free(temp);
#else
	fprintf(stderr, mes, num);
#endif
}